

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall DPlayerMenu::PickPlayerClass(DPlayerMenu *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (1 < PlayerClasses.Count) {
    puVar1 = (undefined8 *)
             ((ulong)(((&DAT_017e5e98)[(long)consoleplayer * 0xa8] - 1 & 0x23c) * 0x18) +
             (&DAT_017e5e88)[(long)consoleplayer * 0x54]);
    do {
      puVar2 = puVar1;
      puVar1 = (undefined8 *)*puVar2;
    } while (*(int *)(puVar2 + 1) != 0x23c);
    uVar3 = *(uint *)(puVar2[2] + 0x28);
    if ((int)uVar3 < 0) {
      uVar3 = (uint)(DMenu::MenuTime >> 7) % PlayerClasses.Count;
    }
  }
  this->PlayerClassIndex = uVar3;
  this->PlayerClass = PlayerClasses.Array + (int)uVar3;
  UpdateTranslation(this);
  return;
}

Assistant:

unsigned int Size () const
	{
		return Count;
	}